

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Func.h
# Opt level: O2

void __thiscall Func::DisableCanDoInlineArgOpt(Func *this)

{
  for (; this != (Func *)0x0; this = this->parentFunc) {
    *(uint *)&this->field_0x240 = *(uint *)&this->field_0x240 & 0xfffff7fd;
    this->frameInfo = (InlineeFrameInfo *)0x0;
  }
  return;
}

Assistant:

void               DisableCanDoInlineArgOpt()
    {
                        Func* curFunc = this;
                        while (curFunc)
                        {
                            curFunc->m_canDoInlineArgsOpt = false;
                            curFunc->m_hasInlineArgsOpt = false;
                            curFunc->frameInfo = nullptr;
                            curFunc = curFunc->GetParentFunc();
                        }
    }